

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O2

void __thiscall
TasGrid::GridSequence::applyTransformationTransposed<1>(GridSequence *this,double *weights)

{
  size_t sVar1;
  pointer piVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  pointer piVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int i;
  ulong uVar9;
  ulong uVar10;
  size_type __n;
  MultiIndexSet *mset;
  double dVar11;
  reference rVar12;
  _Bit_iterator __first;
  _Bit_iterator __last;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<bool,_std::allocator<bool>_> used;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> level;
  Data2D<int> parents;
  allocator_type local_dd;
  int local_dc;
  ulong local_d8;
  _Vector_base<int,_std::allocator<int>_> local_d0;
  double *local_b8;
  undefined1 local_b0 [40];
  _Vector_base<int,_std::allocator<int>_> local_88;
  _Vector_base<int,_std::allocator<int>_> local_70;
  Data2D<int> local_58;
  
  mset = &(this->super_BaseCanonicalGrid).points;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    mset = &(this->super_BaseCanonicalGrid).needed;
  }
  uVar5 = mset->cache_num_indexes;
  local_b8 = weights;
  MultiIndexManipulations::computeLevels((vector<int,_std::allocator<int>_> *)&local_70,mset);
  _Var3 = ::std::
          __max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_70._M_impl.super__Vector_impl_data._M_start,
                     local_70._M_impl.super__Vector_impl_data._M_finish);
  iVar6 = *_Var3._M_current;
  MultiIndexManipulations::computeDAGup(&local_58,mset);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_d0,(long)iVar6 + 1U,
             (allocator_type *)local_b0);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_88,(long)iVar6 + 1U,
             (allocator_type *)local_b0);
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_b0,(long)(int)uVar5,&local_dd);
  if ((int)uVar5 < 1) {
    uVar5 = 0;
  }
  uVar10 = (ulong)uVar5;
  local_d8 = uVar10;
  do {
    if (iVar6 < 1) {
      ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                ((_Bvector_base<std::allocator<bool>_> *)local_b0);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_d0);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&local_58.vec.super__Vector_base<int,_std::allocator<int>_>);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_70);
      return;
    }
    local_dc = iVar6;
    for (uVar9 = 0; uVar9 != uVar10; uVar9 = uVar9 + 1) {
      if (local_70._M_impl.super__Vector_impl_data._M_start[uVar9] == local_dc) {
        sVar1 = mset->num_dimensions;
        piVar2 = (mset->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *local_d0._M_impl.super__Vector_impl_data._M_start = 0;
        *local_88._M_impl.super__Vector_impl_data._M_start = (int)uVar9;
        local_dd = (allocator_type)0x0;
        __first.super__Bit_iterator_base._8_8_ = 0;
        __first.super__Bit_iterator_base._M_p = (_Bit_type *)local_b0._0_8_;
        __last.super__Bit_iterator_base._12_4_ = 0;
        __last.super__Bit_iterator_base._M_p = (_Bit_type *)local_b0._16_8_;
        __last.super__Bit_iterator_base._M_offset = local_b0._24_4_;
        std::__fill_a1(__first,__last,(bool *)&local_dd);
        uVar7 = 0;
        piVar4 = local_d0._M_impl.super__Vector_impl_data._M_start;
        do {
          uVar7 = (ulong)(int)uVar7;
          while( true ) {
            iVar6 = (this->super_BaseCanonicalGrid).num_dimensions;
            if (iVar6 <= *piVar4) goto LAB_001b3e3d;
            if (piVar4[uVar7] < iVar6) break;
            uVar7 = uVar7 - 1;
            piVar4[(int)uVar7] = piVar4[(int)uVar7] + 1;
          }
          iVar6 = local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [(long)local_88._M_impl.super__Vector_impl_data._M_start[uVar7] * local_58.stride
                   + (long)piVar4[uVar7]];
          __n = (size_type)iVar6;
          if ((__n == 0xffffffffffffffff) ||
             (rVar12 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)local_b0,__n),
             piVar4 = local_d0._M_impl.super__Vector_impl_data._M_start,
             (*rVar12._M_p & rVar12._M_mask) != 0)) {
            piVar4[uVar7] = piVar4[uVar7] + 1;
            uVar10 = local_d8;
          }
          else {
            dVar11 = evalBasis(this,(mset->indexes).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start +
                                    mset->num_dimensions * __n,piVar2 + sVar1 * uVar9);
            uVar5 = (this->super_BaseCanonicalGrid).num_dimensions;
            uVar10 = 0;
            if (0 < (int)uVar5) {
              uVar10 = (ulong)uVar5;
            }
            for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
              local_b8[(long)(int)(uVar5 * iVar6) + uVar8] =
                   local_b8[(long)(int)(uVar5 * iVar6) + uVar8] -
                   local_b8[(long)(int)(uVar5 * (int)uVar9) + uVar8] * dVar11;
            }
            rVar12 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)local_b0,__n);
            *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
            uVar5 = (int)uVar7 + 1;
            uVar7 = (ulong)uVar5;
            local_d0._M_impl.super__Vector_impl_data._M_start[(int)uVar5] = 0;
            local_88._M_impl.super__Vector_impl_data._M_start[(int)uVar5] = iVar6;
            piVar4 = local_d0._M_impl.super__Vector_impl_data._M_start;
            uVar10 = local_d8;
          }
        } while( true );
      }
LAB_001b3e3d:
    }
    iVar6 = local_dc + -1;
  } while( true );
}

Assistant:

void GridSequence::applyTransformationTransposed(double weights[]) const{
    // mode 0: applies the transposed linear operator for interpolation and quadrature.
    // mode 1: applies the transposed linear operator for differentiation.
    const MultiIndexSet& work = (points.empty()) ? needed : points;
    int num_points = work.getNumIndexes();

    std::vector<int> level = MultiIndexManipulations::computeLevels(work);
    int top_level = *std::max_element(level.begin(), level.end());

    Data2D<int> parents = MultiIndexManipulations::computeDAGup(work);

    std::vector<int> monkey_count(top_level + 1);
    std::vector<int> monkey_tail(top_level + 1);
    std::vector<bool> used(num_points);

    for(int l=top_level; l>0; l--){
        for(int i=0; i<num_points; i++){
            if (level[i] == l){
                const int* p = work.getIndex(i);
                int current = 0;

                monkey_count[0] = 0;
                monkey_tail[0] = i;
                std::fill(used.begin(), used.end(), false);

                while(monkey_count[0] < num_dimensions){
                    if (monkey_count[current] < num_dimensions){
                        int branch = parents.getStrip(monkey_tail[current])[monkey_count[current]];
                        if ((branch == -1) || used[branch]){
                            monkey_count[current]++;
                        }else{
                            if (mode == 0) {
                                weights[branch] -= weights[i] * evalBasis(work.getIndex(branch), p);
                            } else {
                                double weight_mult = evalBasis(work.getIndex(branch), p);
                                for (int d=0; d<num_dimensions; d++)
                                    weights[branch * num_dimensions + d] -= weights[i * num_dimensions + d] * weight_mult;
                            }
                            used[branch] = true;

                            monkey_count[++current] = 0;
                            monkey_tail[current] = branch;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }
    }
}